

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.cpp
# Opt level: O2

Proto * luaF_newproto(lua_State *L)

{
  GCObject *o;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x78);
  luaC_link(L,o,'\t');
  (o->th).base_ci = (CallInfo *)0x0;
  *(int *)((long)o + 0x58) = 0;
  *(int *)((long)o + 0x5c) = 0;
  (o->p).source = (TString *)0x0;
  (o->th).end_ci = (CallInfo *)0x0;
  (o->h).gclist = (GCObject *)0x0;
  (o->p).upvalues = (TString **)0x0;
  (o->h).node = (Node *)0x0;
  (o->h).lastfree = (Node *)0x0;
  (o->h).metatable = (Table *)0x0;
  (o->h).array = (TValue *)0x0;
  *(int *)((long)o + 0x60) = 0;
  *(int *)((long)o + 100) = 0;
  *(lu_byte *)((long)o + 0x70) = '\0';
  *(lu_byte *)((long)o + 0x71) = '\0';
  *(lu_byte *)((long)o + 0x72) = '\0';
  *(lu_byte *)((long)o + 0x73) = '\0';
  return (Proto *)o;
}

Assistant:

Proto *luaF_newproto (lua_State *L) {
  Proto *f = luaM_new(L, Proto);
  luaC_link(L, obj2gco(f), LUA_TPROTO);
  f->k = NULL;
  f->sizek = 0;
  f->p = NULL;
  f->sizep = 0;
  f->code = NULL;
  f->sizecode = 0;
  f->sizelineinfo = 0;
  f->sizeupvalues = 0;
  f->nups = 0;
  f->upvalues = NULL;
  f->numparams = 0;
  f->is_vararg = 0;
  f->maxstacksize = 0;
  f->lineinfo = NULL;
  f->sizelocvars = 0;
  f->locvars = NULL;
  f->linedefined = 0;
  f->lastlinedefined = 0;
  f->source = NULL;
  return f;
}